

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O3

bool __thiscall
duckdb::ChunkConstantInfo::Cleanup
          (ChunkConstantInfo *this,transaction_t lowest_transaction,
          unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *result)

{
  return this->insert_id <= lowest_transaction && this->delete_id == 0xfffffffffffffffe;
}

Assistant:

bool ChunkConstantInfo::Cleanup(transaction_t lowest_transaction, unique_ptr<ChunkInfo> &result) const {
	if (delete_id != NOT_DELETED_ID) {
		// the chunk info is labeled as deleted - we need to keep it around
		return false;
	}
	if (insert_id > lowest_transaction) {
		// there are still transactions active that need this ChunkInfo
		return false;
	}
	return true;
}